

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O1

gravity_list_t * gravity_function_params_get(gravity_vm *vm,gravity_function_t *f)

{
  return (gravity_list_t *)0x0;
}

Assistant:

gravity_list_t *gravity_function_params_get (gravity_vm *vm, gravity_function_t *f) {
    #pragma unused(vm)
    gravity_list_t *list = NULL;
    
    if (f->tag == EXEC_TYPE_NATIVE) {
        // written by user in Gravity
    } else if (f->tag == EXEC_TYPE_BRIDGED && f->xdata) {
        // ask bridge
    } else if (f->tag == EXEC_TYPE_INTERNAL) {
        // native C function
    }
    
    return list;
}